

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MarkAllShadowTablesOf(sqlite3 *db,Table *pTab)

{
  Index *pIVar1;
  int N;
  int iVar2;
  long *plVar3;
  Table *pOther;
  HashElem *k;
  Module *pMod;
  int nName;
  Table *pTab_local;
  sqlite3 *db_local;
  
  plVar3 = (long *)sqlite3HashFind(&db->aModule,*(pTab->u).vtab.azArg);
  if ((((plVar3 != (long *)0x0) && (*plVar3 != 0)) && (2 < *(int *)*plVar3)) &&
     (*(long *)(*plVar3 + 0xb8) != 0)) {
    N = sqlite3Strlen30(pTab->zName);
    for (pOther = (Table *)(pTab->pSchema->tblHash).first; pOther != (Table *)0x0;
        pOther = (Table *)pOther->zName) {
      pIVar1 = pOther->pIndex;
      if (((*(char *)((long)&pIVar1->aSortOrder + 7) == '\0') &&
          (((ulong)pIVar1->pSchema & 0x1000) == 0)) &&
         ((iVar2 = sqlite3_strnicmp(pIVar1->zName,pTab->zName,N), iVar2 == 0 &&
          ((pIVar1->zName[N] == '_' &&
           (iVar2 = (**(code **)(*plVar3 + 0xb8))(pIVar1->zName + (long)N + 1), iVar2 != 0)))))) {
        *(uint *)&pIVar1->pSchema = *(uint *)&pIVar1->pSchema | 0x1000;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MarkAllShadowTablesOf(sqlite3 *db, Table *pTab){
  int nName;                    /* Length of pTab->zName */
  Module *pMod;                 /* Module for the virtual table */
  HashElem *k;                  /* For looping through the symbol table */

  assert( IsVirtual(pTab) );
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->u.vtab.azArg[0]);
  if( pMod==0 ) return;
  if( NEVER(pMod->pModule==0) ) return;
  if( pMod->pModule->iVersion<3 ) return;
  if( pMod->pModule->xShadowName==0 ) return;
  assert( pTab->zName!=0 );
  nName = sqlite3Strlen30(pTab->zName);
  for(k=sqliteHashFirst(&pTab->pSchema->tblHash); k; k=sqliteHashNext(k)){
    Table *pOther = sqliteHashData(k);
    assert( pOther->zName!=0 );
    if( !IsOrdinaryTable(pOther) ) continue;
    if( pOther->tabFlags & TF_Shadow ) continue;
    if( sqlite3StrNICmp(pOther->zName, pTab->zName, nName)==0
     && pOther->zName[nName]=='_'
     && pMod->pModule->xShadowName(pOther->zName+nName+1)
    ){
      pOther->tabFlags |= TF_Shadow;
    }
  }
}